

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O1

hrgls_Status
hrgls_DataBlobSourceCreate
          (hrgls_DataBlobSource *returnStream,hrgls_DataBlobSourceCreateParams params)

{
  API *api;
  pointer pcVar1;
  hrgls_Status hVar2;
  hrgls_DataBlobSource phVar3;
  DataBlobSource *this;
  StreamProperties *props;
  string local_50;
  
  hVar2 = 0x3e9;
  if ((params != (hrgls_DataBlobSourceCreateParams)0x0 &&
       returnStream != (hrgls_DataBlobSource *)0x0) && (params->api != (hrgls_API)0x0)) {
    phVar3 = (hrgls_DataBlobSource)operator_new(0x38);
    phVar3->stream = (DataBlobSource *)0x0;
    phVar3->CHandler = (hrgls_DataBlobSourceCallback)0x0;
    phVar3->CUserData = (void *)0x0;
    (phVar3->info).name._M_dataplus._M_p = (pointer)&(phVar3->info).name.field_2;
    (phVar3->info).name._M_string_length = 0;
    (phVar3->info).name.field_2._M_local_buf[0] = '\0';
    if (params->streamProperties == (hrgls_StreamProperties)0x0) {
      props = (StreamProperties *)0x0;
    }
    else {
      props = params->streamProperties->props;
    }
    this = (DataBlobSource *)operator_new(8);
    api = params->api->api;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar1 = (params->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + (params->name)._M_string_length);
    hrgls::datablob::DataBlobSource::DataBlobSource(this,api,props,&local_50);
    phVar3->stream = this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    *returnStream = phVar3;
    hVar2 = hrgls::datablob::DataBlobSource::GetStatus(phVar3->stream);
  }
  return hVar2;
}

Assistant:

hrgls_Status hrgls_DataBlobSourceCreate(hrgls_DataBlobSource *returnStream,
    hrgls_DataBlobSourceCreateParams params)
  {
    hrgls_Status s;

    // Check the parameters.
    if (!returnStream || !params || !params->api) {
      return hrgls_STATUS_BAD_PARAMETER;
    }

    // Attempt to construct the object.
    s = hrgls_STATUS_OKAY;
    hrgls_DataBlobSource ret;
    try {
      ret = new hrgls_DataBlobSource_;
    } catch (...) {
      s = hrgls_STATUS_OUT_OF_MEMORY;
      ret = nullptr;
    }
    try {
      // Get the C++ parameters out of the C structure pointers.
      hrgls::StreamProperties *prop = nullptr;
      if (params->streamProperties) { prop = params->streamProperties->props; }
      ret->stream = new hrgls::datablob::DataBlobSource(*params->api->api, *prop,
        params->name);
    } catch (...) {
      s = hrgls_STATUS_OUT_OF_MEMORY;
      ret->stream = nullptr;
      delete ret;
      ret = nullptr;
    }
    *returnStream = ret;
    return ret->stream->GetStatus();
  }